

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

bool qt_painterpath_check_crossing(QPainterPath *path,QRectF *rect)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  QRectF *in_RSI;
  long in_FS_OFFSET;
  bool contained;
  Element *e;
  int i;
  anon_enum_32 edgeStatus;
  QBezier bezier;
  QPointF ep;
  QPointF cp2;
  QPointF last_start;
  QPointF last_pt;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  QPointF *in_stack_fffffffffffffe30;
  Element *in_stack_fffffffffffffe38;
  QPointF *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  QPointF *in_stack_fffffffffffffe50;
  QRectF *in_stack_fffffffffffffe58;
  QBezier *in_stack_fffffffffffffe60;
  QRectF *in_stack_fffffffffffffe68;
  qreal in_stack_fffffffffffffe70;
  qreal in_stack_fffffffffffffe78;
  int local_120;
  int local_11c;
  bool local_101;
  undefined1 local_f0 [88];
  QPointF local_98;
  QPointF local_70;
  QPointF local_60;
  QPointF local_50;
  int local_30;
  QPointF local_28;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.xp = -NAN;
  local_18.yp = -NAN;
  QPointF::QPointF(&local_18);
  local_28.xp = -NAN;
  local_28.yp = -NAN;
  QPointF::QPointF(&local_28);
  local_11c = 0;
  for (local_120 = 0; iVar3 = QPainterPath::elementCount((QPainterPath *)in_stack_fffffffffffffe30),
      local_120 < iVar3; local_120 = local_120 + 1) {
    QPainterPath::elementAt
              ((QPainterPath *)in_stack_fffffffffffffe40,
               (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    if (local_30 == 0) {
      if (0 < local_120) {
        QPointF::x(&local_18);
        QPointF::x(&local_28);
        bVar1 = qFuzzyCompare((double)in_stack_fffffffffffffe58,(double)in_stack_fffffffffffffe50);
        if (bVar1) {
          QPointF::y(&local_18);
          QPointF::y(&local_28);
          bVar1 = qFuzzyCompare((double)in_stack_fffffffffffffe58,(double)in_stack_fffffffffffffe50)
          ;
          if (bVar1) {
            QPointF::x(&local_18);
            QPointF::y(&local_18);
            QPointF::x(&local_28);
            QPointF::y(&local_28);
            bVar1 = qt_painterpath_isect_line_rect
                              (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                               (qreal)in_stack_fffffffffffffe68,(qreal)in_stack_fffffffffffffe60,
                               in_stack_fffffffffffffe58);
            if (bVar1) {
              local_101 = true;
              goto LAB_005bb8fd;
            }
          }
        }
      }
      local_50 = QPainterPath::Element::operator_cast_to_QPointF(in_stack_fffffffffffffe38);
      local_18.xp = local_50.xp;
      local_18.yp = local_50.yp;
      local_28.xp = local_50.xp;
      local_28.yp = local_50.yp;
    }
    else if (local_30 == 1) {
      QPointF::x(&local_18);
      QPointF::y(&local_18);
      bVar1 = qt_painterpath_isect_line_rect
                        (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                         (qreal)in_stack_fffffffffffffe68,(qreal)in_stack_fffffffffffffe60,
                         in_stack_fffffffffffffe58);
      if (bVar1) {
        local_101 = true;
        goto LAB_005bb8fd;
      }
      local_60 = QPainterPath::Element::operator_cast_to_QPointF(in_stack_fffffffffffffe38);
      local_18.xp = local_60.xp;
      local_18.yp = local_60.yp;
    }
    else if (local_30 == 2) {
      local_70.yp = -NAN;
      local_70.xp = -NAN;
      QPainterPath::elementAt
                ((QPainterPath *)in_stack_fffffffffffffe40,
                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      local_70 = QPainterPath::Element::operator_cast_to_QPointF(in_stack_fffffffffffffe38);
      local_98.yp = -NAN;
      local_98.xp = -NAN;
      local_120 = local_120 + 2;
      QPainterPath::elementAt
                ((QPainterPath *)in_stack_fffffffffffffe40,
                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      local_98 = QPainterPath::Element::operator_cast_to_QPointF(in_stack_fffffffffffffe38);
      memset(local_f0,0xff,0x40);
      QPainterPath::Element::operator_cast_to_QPointF(in_stack_fffffffffffffe38);
      QBezier::fromPoints(in_stack_fffffffffffffe50,
                          (QPointF *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                          in_stack_fffffffffffffe40,(QPointF *)in_stack_fffffffffffffe38);
      QRectF::top(in_RSI);
      QRectF::left(in_RSI);
      QRectF::right(in_RSI);
      bVar1 = qt_isect_curve_horizontal
                        (in_stack_fffffffffffffe60,(qreal)in_stack_fffffffffffffe58,
                         (qreal)in_stack_fffffffffffffe50,
                         (qreal)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                         (int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
      if (!bVar1) {
        in_stack_fffffffffffffe78 = QRectF::bottom(in_RSI);
        in_stack_fffffffffffffe70 = QRectF::left(in_RSI);
        QRectF::right(in_RSI);
        bVar1 = qt_isect_curve_horizontal
                          (in_stack_fffffffffffffe60,(qreal)in_stack_fffffffffffffe58,
                           (qreal)in_stack_fffffffffffffe50,
                           (qreal)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                           (int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
        if (!bVar1) {
          in_stack_fffffffffffffe68 = (QRectF *)QRectF::left(in_RSI);
          in_stack_fffffffffffffe60 = (QBezier *)QRectF::top(in_RSI);
          QRectF::bottom(in_RSI);
          bVar1 = qt_isect_curve_vertical
                            (in_stack_fffffffffffffe60,(qreal)in_stack_fffffffffffffe58,
                             (qreal)in_stack_fffffffffffffe50,
                             (qreal)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                             (int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
          if (!bVar1) {
            in_stack_fffffffffffffe58 = (QRectF *)QRectF::right(in_RSI);
            in_stack_fffffffffffffe50 = (QPointF *)QRectF::top(in_RSI);
            QRectF::bottom(in_RSI);
            bVar1 = qt_isect_curve_vertical
                              (in_stack_fffffffffffffe60,(qreal)in_stack_fffffffffffffe58,
                               (qreal)in_stack_fffffffffffffe50,
                               (qreal)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                               (int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
            if (!bVar1) {
              local_18.xp = local_98.xp;
              local_18.yp = local_98.yp;
              goto LAB_005bb770;
            }
          }
        }
      }
      local_101 = true;
      goto LAB_005bb8fd;
    }
LAB_005bb770:
    bVar1 = pointOnEdge(in_stack_fffffffffffffe68,(QPointF *)in_stack_fffffffffffffe60);
    if (bVar1) {
      bVar1 = operator==(in_stack_fffffffffffffe30,
                         (QPointF *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
      if (bVar1) {
        local_11c = 0;
      }
    }
    else {
      bVar2 = QRectF::contains((QPointF *)in_RSI);
      in_stack_fffffffffffffe4c = local_11c;
      if (local_11c == 0) {
        local_11c = 2;
        if ((bVar2 & 1) != 0) {
          local_11c = 1;
        }
      }
      else if (local_11c == 1) {
        if ((bVar2 & 1) == 0) {
          local_101 = true;
          goto LAB_005bb8fd;
        }
      }
      else if ((local_11c == 2) && ((bVar2 & 1) != 0)) {
        local_101 = true;
        goto LAB_005bb8fd;
      }
    }
  }
  bVar1 = operator!=(in_stack_fffffffffffffe30,
                     (QPointF *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  if (bVar1) {
    QPointF::x(&local_18);
    QPointF::y(&local_18);
    QPointF::x(&local_28);
    QPointF::y(&local_28);
    bVar1 = qt_painterpath_isect_line_rect
                      (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                       (qreal)in_stack_fffffffffffffe68,(qreal)in_stack_fffffffffffffe60,
                       in_stack_fffffffffffffe58);
    if (bVar1) {
      local_101 = true;
      goto LAB_005bb8fd;
    }
  }
  local_101 = false;
LAB_005bb8fd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_101;
}

Assistant:

static bool qt_painterpath_check_crossing(const QPainterPath *path, const QRectF &rect)
{
    QPointF last_pt;
    QPointF last_start;
    enum { OnRect, InsideRect, OutsideRect} edgeStatus = OnRect;
    for (int i=0; i<path->elementCount(); ++i) {
        const QPainterPath::Element &e = path->elementAt(i);

        switch (e.type) {

        case QPainterPath::MoveToElement:
            if (i > 0
                && qFuzzyCompare(last_pt.x(), last_start.x())
                && qFuzzyCompare(last_pt.y(), last_start.y())
                && qt_painterpath_isect_line_rect(last_pt.x(), last_pt.y(),
                                                  last_start.x(), last_start.y(), rect))
                return true;
            last_start = last_pt = e;
            break;

        case QPainterPath::LineToElement:
            if (qt_painterpath_isect_line_rect(last_pt.x(), last_pt.y(), e.x, e.y, rect))
                return true;
            last_pt = e;
            break;

        case QPainterPath::CurveToElement:
            {
                QPointF cp2 = path->elementAt(++i);
                QPointF ep = path->elementAt(++i);
                QBezier bezier = QBezier::fromPoints(last_pt, e, cp2, ep);
                if (qt_isect_curve_horizontal(bezier, rect.top(), rect.left(), rect.right())
                    || qt_isect_curve_horizontal(bezier, rect.bottom(), rect.left(), rect.right())
                    || qt_isect_curve_vertical(bezier, rect.left(), rect.top(), rect.bottom())
                    || qt_isect_curve_vertical(bezier, rect.right(), rect.top(), rect.bottom()))
                    return true;
                last_pt = ep;
            }
            break;

        default:
            break;
        }
        // Handle crossing the edges of the rect at the end-points of individual sub-paths.
        // A point on on the edge itself is considered neither inside nor outside for this purpose.
        if (!pointOnEdge(rect, last_pt)) {
            bool contained = rect.contains(last_pt);
            switch (edgeStatus) {
            case OutsideRect:
                if (contained)
                    return true;
                break;
            case InsideRect:
                if (!contained)
                    return true;
                break;
            case OnRect:
                edgeStatus = contained ? InsideRect : OutsideRect;
                break;
            }
        } else {
            if (last_pt == last_start)
                edgeStatus = OnRect;
        }
    }

    // implicitly close last subpath
    if (last_pt != last_start
        && qt_painterpath_isect_line_rect(last_pt.x(), last_pt.y(),
                                          last_start.x(), last_start.y(), rect))
        return true;

    return false;
}